

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

void __thiscall
icu_63::CollationIterator::appendNumericSegmentCEs
          (CollationIterator *this,char *digits,int32_t length,UErrorCode *errorCode)

{
  uint uVar1;
  int iVar2;
  int64_t iVar3;
  bool bVar4;
  int local_5c;
  int local_58;
  int32_t shift;
  int32_t pos;
  uint32_t pair;
  uint32_t primary;
  int32_t numPairs;
  uint32_t primary_3;
  uint32_t primary_2;
  uint32_t primary_1;
  int32_t numBytes;
  int32_t firstByte;
  int32_t i;
  int32_t value;
  uint32_t numericPrimary;
  UErrorCode *errorCode_local;
  int32_t length_local;
  char *digits_local;
  CollationIterator *this_local;
  
  uVar1 = this->data->numericPrimary;
  if (length < 8) {
    firstByte = (int32_t)*digits;
    for (numBytes = 1; numBytes < length; numBytes = numBytes + 1) {
      firstByte = firstByte * 10 + (int)digits[numBytes];
    }
    if (firstByte < 0x4a) {
      iVar3 = Collation::makeCE(uVar1 | (firstByte + 2) * 0x10000);
      CEBuffer::append(&this->ceBuffer,iVar3,errorCode);
      return;
    }
    iVar2 = firstByte + -0x4a;
    if (iVar2 < 0x27b0) {
      iVar3 = Collation::makeCE(uVar1 | (iVar2 / 0xfe + 0x4c) * 0x10000 | (iVar2 % 0xfe + 2) * 0x100
                               );
      CEBuffer::append(&this->ceBuffer,iVar3,errorCode);
      return;
    }
    iVar2 = firstByte + -0x27fa;
    if (iVar2 < 0xfc040) {
      iVar3 = Collation::makeCE((((iVar2 / 0xfe) / 0xfe) % 0xfe + 0x74) * 0x10000 |
                                ((iVar2 / 0xfe) % 0xfe + 2) * 0x100 | uVar1 | iVar2 % 0xfe + 2U);
      CEBuffer::append(&this->ceBuffer,iVar3,errorCode);
      return;
    }
  }
  pos = uVar1 | ((length + 1) / 2 + 0x80) * 0x10000;
  errorCode_local._4_4_ = length;
  while( true ) {
    bVar4 = false;
    if (digits[(int)(errorCode_local._4_4_ - 1)] == '\0') {
      bVar4 = digits[(int)(errorCode_local._4_4_ - 2)] == '\0';
    }
    if (!bVar4) break;
    errorCode_local._4_4_ = errorCode_local._4_4_ - 2;
  }
  if ((errorCode_local._4_4_ & 1) == 0) {
    shift = *digits * 10 + (int)digits[1];
    local_58 = 2;
  }
  else {
    shift = (int32_t)*digits;
    local_58 = 1;
  }
  local_5c = 8;
  while( true ) {
    iVar2 = shift * 2;
    shift = iVar2 + 0xb;
    if ((int)errorCode_local._4_4_ <= local_58) break;
    if (local_5c == 0) {
      iVar3 = Collation::makeCE(shift | pos);
      CEBuffer::append(&this->ceBuffer,iVar3,errorCode);
      local_5c = 0x10;
      pos = uVar1;
    }
    else {
      pos = shift << ((byte)local_5c & 0x1f) | pos;
      local_5c = local_5c + -8;
    }
    shift = digits[local_58] * 10 + (int)digits[local_58 + 1];
    local_58 = local_58 + 2;
  }
  iVar3 = Collation::makeCE(iVar2 + 10 << ((byte)local_5c & 0x1f) | pos);
  CEBuffer::append(&this->ceBuffer,iVar3,errorCode);
  return;
}

Assistant:

void
CollationIterator::appendNumericSegmentCEs(const char *digits, int32_t length, UErrorCode &errorCode) {
    U_ASSERT(1 <= length && length <= 254);
    U_ASSERT(length == 1 || digits[0] != 0);
    uint32_t numericPrimary = data->numericPrimary;
    // Note: We use primary byte values 2..255: digits are not compressible.
    if(length <= 7) {
        // Very dense encoding for small numbers.
        int32_t value = digits[0];
        for(int32_t i = 1; i < length; ++i) {
            value = value * 10 + digits[i];
        }
        // Primary weight second byte values:
        //     74 byte values   2.. 75 for small numbers in two-byte primary weights.
        //     40 byte values  76..115 for medium numbers in three-byte primary weights.
        //     16 byte values 116..131 for large numbers in four-byte primary weights.
        //    124 byte values 132..255 for very large numbers with 4..127 digit pairs.
        int32_t firstByte = 2;
        int32_t numBytes = 74;
        if(value < numBytes) {
            // Two-byte primary for 0..73, good for day & month numbers etc.
            uint32_t primary = numericPrimary | ((firstByte + value) << 16);
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        value -= numBytes;
        firstByte += numBytes;
        numBytes = 40;
        if(value < numBytes * 254) {
            // Three-byte primary for 74..10233=74+40*254-1, good for year numbers and more.
            uint32_t primary = numericPrimary |
                ((firstByte + value / 254) << 16) | ((2 + value % 254) << 8);
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        value -= numBytes * 254;
        firstByte += numBytes;
        numBytes = 16;
        if(value < numBytes * 254 * 254) {
            // Four-byte primary for 10234..1042489=10234+16*254*254-1.
            uint32_t primary = numericPrimary | (2 + value % 254);
            value /= 254;
            primary |= (2 + value % 254) << 8;
            value /= 254;
            primary |= (firstByte + value % 254) << 16;
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        // original value > 1042489
    }
    U_ASSERT(length >= 7);

    // The second primary byte value 132..255 indicates the number of digit pairs (4..127),
    // then we generate primary bytes with those pairs.
    // Omit trailing 00 pairs.
    // Decrement the value for the last pair.

    // Set the exponent. 4 pairs->132, 5 pairs->133, ..., 127 pairs->255.
    int32_t numPairs = (length + 1) / 2;
    uint32_t primary = numericPrimary | ((132 - 4 + numPairs) << 16);
    // Find the length without trailing 00 pairs.
    while(digits[length - 1] == 0 && digits[length - 2] == 0) {
        length -= 2;
    }
    // Read the first pair.
    uint32_t pair;
    int32_t pos;
    if(length & 1) {
        // Only "half a pair" if we have an odd number of digits.
        pair = digits[0];
        pos = 1;
    } else {
        pair = digits[0] * 10 + digits[1];
        pos = 2;
    }
    pair = 11 + 2 * pair;
    // Add the pairs of digits between pos and length.
    int32_t shift = 8;
    while(pos < length) {
        if(shift == 0) {
            // Every three pairs/bytes we need to store a 4-byte-primary CE
            // and start with a new CE with the '0' primary lead byte.
            primary |= pair;
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            primary = numericPrimary;
            shift = 16;
        } else {
            primary |= pair << shift;
            shift -= 8;
        }
        pair = 11 + 2 * (digits[pos] * 10 + digits[pos + 1]);
        pos += 2;
    }
    primary |= (pair - 1) << shift;
    ceBuffer.append(Collation::makeCE(primary), errorCode);
}